

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O3

int64_t __thiscall
aeron::ClientConductor::addCounter
          (ClientConductor *this,int32_t typeId,uint8_t *keyBuffer,size_t keyLength,string *label)

{
  char *pcVar1;
  _Alloc_hider _Var2;
  int iVar3;
  SourcedException *pSVar4;
  char *pcVar5;
  char *pcVar6;
  int64_t registrationId;
  allocator local_b1;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  verifyDriverIsActive(this);
  ensureOpen(this);
  if (0x70 < keyLength) {
    pSVar4 = (SourcedException *)__cxa_allocate_exception(0x48);
    std::__cxx11::to_string(&local_b0,keyLength);
    std::operator+(&local_90,"key length out of bounds: ",&local_b0);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,
               "std::int64_t aeron::ClientConductor::addCounter(std::int32_t, const std::uint8_t *, std::size_t, const std::string &)"
               ,"");
    pcVar6 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ClientConductor.cpp"
    ;
    pcVar5 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
    do {
      pcVar5 = pcVar5 + 1;
      pcVar1 = pcVar6 + 1;
      pcVar6 = pcVar6 + 1;
    } while (*pcVar5 == *pcVar1);
    std::__cxx11::string::string((string *)&local_50,pcVar6 + (*pcVar1 == '/'),&local_b1);
    util::SourcedException::SourcedException(pSVar4,&local_90,&local_70,&local_50,0x142);
    *(undefined ***)pSVar4 = &PTR__SourcedException_00163440;
    __cxa_throw(pSVar4,&util::IllegalArgumentException::typeinfo,
                util::SourcedException::~SourcedException);
  }
  if (0x17c < label->_M_string_length) {
    pSVar4 = (SourcedException *)__cxa_allocate_exception(0x48);
    std::__cxx11::to_string(&local_b0,label->_M_string_length);
    std::operator+(&local_90,"label length out of bounds: ",&local_b0);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,
               "std::int64_t aeron::ClientConductor::addCounter(std::int32_t, const std::uint8_t *, std::size_t, const std::string &)"
               ,"");
    pcVar6 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ClientConductor.cpp"
    ;
    pcVar5 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
    do {
      pcVar5 = pcVar5 + 1;
      pcVar1 = pcVar6 + 1;
      pcVar6 = pcVar6 + 1;
    } while (*pcVar5 == *pcVar1);
    std::__cxx11::string::string((string *)&local_50,pcVar6 + (*pcVar1 == '/'),&local_b1);
    util::SourcedException::SourcedException(pSVar4,&local_90,&local_70,&local_50,0x147);
    *(undefined ***)pSVar4 = &PTR__SourcedException_00163440;
    __cxa_throw(pSVar4,&util::IllegalArgumentException::typeinfo,
                util::SourcedException::~SourcedException);
  }
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_adminLock);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  local_90._M_dataplus._M_p =
       (pointer)DriverProxy::addCounter(this->m_driverProxy,typeId,keyBuffer,keyLength,label);
  if ((this->m_epochClock).super__Function_base._M_manager != (_Manager_type)0x0) {
    local_b0._M_dataplus._M_p =
         (pointer)(*(this->m_epochClock)._M_invoker)((_Any_data *)&this->m_epochClock);
    std::
    vector<aeron::ClientConductor::CounterStateDefn,std::allocator<aeron::ClientConductor::CounterStateDefn>>
    ::emplace_back<long&,long_long>
              ((vector<aeron::ClientConductor::CounterStateDefn,std::allocator<aeron::ClientConductor::CounterStateDefn>>
                *)&this->m_counters,(long *)&local_90,(longlong *)&local_b0);
    _Var2._M_p = local_90._M_dataplus._M_p;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_adminLock);
    return (int64_t)_Var2._M_p;
  }
  std::__throw_bad_function_call();
}

Assistant:

std::int64_t ClientConductor::addCounter(
    std::int32_t typeId, const std::uint8_t *keyBuffer, std::size_t keyLength, const std::string& label)
{
    verifyDriverIsActive();
    ensureOpen();

    if (keyLength > CountersManager::MAX_KEY_LENGTH)
    {
        throw IllegalArgumentException("key length out of bounds: " + std::to_string(keyLength), SOURCEINFO);
    }

    if (label.length() > CountersManager::MAX_LABEL_LENGTH)
    {
        throw IllegalArgumentException("label length out of bounds: " + std::to_string(label.length()), SOURCEINFO);
    }

    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    std::int64_t registrationId = m_driverProxy.addCounter(typeId, keyBuffer, keyLength, label);

    m_counters.emplace_back(registrationId, m_epochClock());

    return registrationId;
}